

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  float *pfVar2;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImRect local_34;
  int local_24;
  ImGuiContext *pIStack_20;
  int nav_layer;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  pIStack_20 = GImGui;
  g = (ImGuiContext *)window;
  window_local._4_4_ = id;
  if (id != 0) {
    local_24 = (window->DC).NavLayerCurrent;
    if (GImGui->NavWindow != window) {
      GImGui->NavInitRequest = false;
    }
    pIVar1->NavId = id;
    pIVar1->NavWindow = window;
    pIVar1->NavLayer = local_24;
    window->NavLastIds[local_24] = id;
    if ((window->DC).LastItemId == id) {
      local_3c = ::operator-(&(window->DC).LastItemRect.Min,&window->Pos);
      local_44 = ::operator-((ImVec2 *)&(g->IO).KeySuper,&(g->IO).DisplaySize);
      ImRect::ImRect(&local_34,&local_3c,&local_44);
      pfVar2 = &(g->IO).MouseClickedPos[(long)local_24 * 2 + -6].y;
      *(ImVec2 *)pfVar2 = local_34.Min;
      *(ImVec2 *)(pfVar2 + 2) = local_34.Max;
    }
    if (pIStack_20->ActiveIdSource == ImGuiInputSource_Nav) {
      pIStack_20->NavDisableMouseHover = true;
    }
    else {
      pIStack_20->NavDisableHighlight = true;
    }
    return;
  }
  __assert_fail("id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                ,0x821,"void ImGui::SetFocusID(ImGuiID, ImGuiWindow *)");
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its NavLayer is the current layer, which is the case everywhere we call it.
    const int nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavId = id;
    g.NavWindow = window;
    g.NavLayer = nav_layer;
    window->NavLastIds[nav_layer] = id;
    if (window->DC.LastItemId == id)
        window->NavRectRel[nav_layer] = ImRect(window->DC.LastItemRect.Min - window->Pos, window->DC.LastItemRect.Max - window->Pos);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}